

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexVerifierUtil.cpp
# Opt level: O0

void tcu::TexVerifierUtil::getPossibleCubeFaces
               (Vec3 *coord,IVec3 *bits,CubeFace *faces,int *numFaces)

{
  int iVar1;
  float x_00;
  float x_01;
  float x_02;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float ez;
  float ey;
  float ex;
  float az;
  float ay;
  float ax;
  float z;
  float y;
  float x;
  int *numFaces_local;
  CubeFace *faces_local;
  IVec3 *bits_local;
  Vec3 *coord_local;
  
  x_00 = Vector<float,_3>::x(coord);
  x_01 = Vector<float,_3>::y(coord);
  x_02 = Vector<float,_3>::z(coord);
  fVar2 = de::abs<float>(x_00);
  fVar3 = de::abs<float>(x_01);
  fVar4 = de::abs<float>(x_02);
  iVar1 = Vector<int,_3>::x(bits);
  fVar5 = computeFloatingPointError(x_00,iVar1);
  iVar1 = Vector<int,_3>::y(bits);
  fVar6 = computeFloatingPointError(x_01,iVar1);
  iVar1 = Vector<int,_3>::z(bits);
  fVar7 = computeFloatingPointError(x_02,iVar1);
  *numFaces = 0;
  if ((fVar2 - fVar5 <= fVar3 + fVar6) || (fVar2 - fVar5 <= fVar4 + fVar7)) {
    if ((fVar3 - fVar6 <= fVar2 + fVar5) || (fVar3 - fVar6 <= fVar4 + fVar7)) {
      if ((fVar4 - fVar7 <= fVar2 + fVar5) || (fVar4 - fVar7 <= fVar3 + fVar6)) {
        if (fVar5 < fVar2) {
          iVar1 = *numFaces;
          *numFaces = iVar1 + 1;
          faces[iVar1] = CUBEFACE_NEGATIVE_X;
          iVar1 = *numFaces;
          *numFaces = iVar1 + 1;
          faces[iVar1] = CUBEFACE_POSITIVE_X;
        }
        if (fVar6 < fVar3) {
          iVar1 = *numFaces;
          *numFaces = iVar1 + 1;
          faces[iVar1] = CUBEFACE_NEGATIVE_Y;
          iVar1 = *numFaces;
          *numFaces = iVar1 + 1;
          faces[iVar1] = CUBEFACE_POSITIVE_Y;
        }
        if (fVar7 < fVar4) {
          iVar1 = *numFaces;
          *numFaces = iVar1 + 1;
          faces[iVar1] = CUBEFACE_NEGATIVE_Z;
          iVar1 = *numFaces;
          *numFaces = iVar1 + 1;
          faces[iVar1] = CUBEFACE_POSITIVE_Z;
        }
      }
      else {
        if (fVar7 <= x_02) {
          iVar1 = *numFaces;
          *numFaces = iVar1 + 1;
          faces[iVar1] = CUBEFACE_POSITIVE_Z;
        }
        if (x_02 <= fVar7) {
          iVar1 = *numFaces;
          *numFaces = iVar1 + 1;
          faces[iVar1] = CUBEFACE_NEGATIVE_Z;
        }
      }
    }
    else {
      if (fVar6 <= x_01) {
        iVar1 = *numFaces;
        *numFaces = iVar1 + 1;
        faces[iVar1] = CUBEFACE_POSITIVE_Y;
      }
      if (x_01 <= fVar6) {
        iVar1 = *numFaces;
        *numFaces = iVar1 + 1;
        faces[iVar1] = CUBEFACE_NEGATIVE_Y;
      }
    }
  }
  else {
    if (fVar5 <= x_00) {
      iVar1 = *numFaces;
      *numFaces = iVar1 + 1;
      faces[iVar1] = CUBEFACE_POSITIVE_X;
    }
    if (x_00 <= fVar5) {
      iVar1 = *numFaces;
      *numFaces = iVar1 + 1;
      faces[iVar1] = CUBEFACE_NEGATIVE_X;
    }
  }
  return;
}

Assistant:

void getPossibleCubeFaces (const Vec3& coord, const IVec3& bits, CubeFace* faces, int& numFaces)
{
	const float	x	= coord.x();
	const float	y	= coord.y();
	const float	z	= coord.z();
	const float ax	= de::abs(x);
	const float ay	= de::abs(y);
	const float az	= de::abs(z);
	const float ex	= computeFloatingPointError(x, bits.x());
	const float	ey	= computeFloatingPointError(y, bits.y());
	const float ez	= computeFloatingPointError(z, bits.z());

	numFaces = 0;

	if (ay+ey < ax-ex && az+ez < ax-ex)
	{
		if (x >= ex) faces[numFaces++] = CUBEFACE_POSITIVE_X;
		if (x <= ex) faces[numFaces++] = CUBEFACE_NEGATIVE_X;
	}
	else if (ax+ex < ay-ey && az+ez < ay-ey)
	{
		if (y >= ey) faces[numFaces++] = CUBEFACE_POSITIVE_Y;
		if (y <= ey) faces[numFaces++] = CUBEFACE_NEGATIVE_Y;
	}
	else if (ax+ex < az-ez && ay+ey < az-ez)
	{
		if (z >= ez) faces[numFaces++] = CUBEFACE_POSITIVE_Z;
		if (z <= ez) faces[numFaces++] = CUBEFACE_NEGATIVE_Z;
	}
	else
	{
		// One or more components are equal (or within error bounds). Allow all faces where major axis is not zero.
		if (ax > ex)
		{
			faces[numFaces++] = CUBEFACE_NEGATIVE_X;
			faces[numFaces++] = CUBEFACE_POSITIVE_X;
		}

		if (ay > ey)
		{
			faces[numFaces++] = CUBEFACE_NEGATIVE_Y;
			faces[numFaces++] = CUBEFACE_POSITIVE_Y;
		}

		if (az > ez)
		{
			faces[numFaces++] = CUBEFACE_NEGATIVE_Z;
			faces[numFaces++] = CUBEFACE_POSITIVE_Z;
		}
	}
}